

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObservation.h
# Opt level: O2

double __thiscall CEObservation::GetAzimuth_Rad(CEObservation *this)

{
  double dVar1;
  undefined1 local_60 [80];
  
  UpdateCoordinates(this);
  CEDate::CEDate((CEDate *)(local_60 + 0x10),2451545.0,JD);
  CESkyCoord::XCoord((CESkyCoord *)local_60,(CEDate *)&this->cached_coords_);
  dVar1 = CEAngle::Rad((CEAngle *)local_60);
  CEAngle::~CEAngle((CEAngle *)local_60);
  CEDate::~CEDate((CEDate *)(local_60 + 0x10));
  return dVar1;
}

Assistant:

inline
double CEObservation::GetAzimuth_Rad()
{
    UpdateCoordinates();
    return cached_coords_.XCoord().Rad();
}